

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::sameCoopMatBaseType(TType *this,TType *right)

{
  bool bVar1;
  int iVar2;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_19;
  bool rv;
  TType *right_local;
  TType *this_local;
  
  local_19 = false;
  bVar1 = isCoopMatNV(this);
  if (bVar1) {
    bVar1 = isCoopMatNV(this);
    if (bVar1) {
      isCoopMatNV(right);
    }
    iVar2 = (*this->_vptr_TType[7])();
    if ((iVar2 == 1) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 3)) {
      iVar2 = (*right->_vptr_TType[7])();
      local_2a = true;
      if (iVar2 != 1) {
        iVar2 = (*right->_vptr_TType[7])();
        local_2a = iVar2 == 3;
      }
      local_19 = local_2a;
    }
    else {
      iVar2 = (*this->_vptr_TType[7])();
      if (((iVar2 == 9) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 5)) ||
         (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 7)) {
        iVar2 = (*right->_vptr_TType[7])();
        local_2b = true;
        if (iVar2 != 9) {
          iVar2 = (*right->_vptr_TType[7])();
          local_2b = true;
          if (iVar2 != 5) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2b = iVar2 == 7;
          }
        }
        local_19 = local_2b;
      }
      else {
        iVar2 = (*this->_vptr_TType[7])();
        if (((iVar2 == 8) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 4)) ||
           (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 6)) {
          iVar2 = (*right->_vptr_TType[7])();
          local_2c = true;
          if (iVar2 != 8) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2c = true;
            if (iVar2 != 4) {
              iVar2 = (*right->_vptr_TType[7])();
              local_2c = iVar2 == 6;
            }
          }
          local_19 = local_2c;
        }
        else {
          local_19 = false;
        }
      }
    }
  }
  else {
    bVar1 = isCoopMatKHR(this);
    if ((bVar1) && (bVar1 = isCoopMatKHR(right), bVar1)) {
      iVar2 = (*this->_vptr_TType[7])();
      if ((iVar2 == 1) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 3)) {
        iVar2 = (*right->_vptr_TType[7])();
        local_2d = true;
        if (iVar2 != 1) {
          iVar2 = (*right->_vptr_TType[7])();
          local_2d = true;
          if (iVar2 != 3) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2d = iVar2 == 0x15;
          }
        }
        local_19 = local_2d;
      }
      else {
        iVar2 = (*this->_vptr_TType[7])();
        if (((iVar2 == 9) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 5)) ||
           (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 7)) {
          iVar2 = (*right->_vptr_TType[7])();
          local_2e = true;
          if (iVar2 != 9) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2e = true;
            if (iVar2 != 5) {
              iVar2 = (*right->_vptr_TType[7])();
              local_2e = true;
              if (iVar2 != 7) {
                iVar2 = (*right->_vptr_TType[7])();
                local_2e = iVar2 == 0x15;
              }
            }
          }
          local_19 = local_2e;
        }
        else {
          iVar2 = (*this->_vptr_TType[7])();
          if (((iVar2 == 8) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 4)) ||
             (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 6)) {
            iVar2 = (*right->_vptr_TType[7])();
            local_2f = true;
            if (iVar2 != 8) {
              iVar2 = (*right->_vptr_TType[7])();
              local_2f = true;
              if (iVar2 != 4) {
                iVar2 = (*right->_vptr_TType[7])();
                local_2f = true;
                if (iVar2 != 6) {
                  iVar2 = (*right->_vptr_TType[7])();
                  local_2f = iVar2 == 0x15;
                }
              }
            }
            local_19 = local_2f;
          }
          else {
            local_19 = false;
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool sameCoopMatBaseType(const TType &right) const {
        bool rv = false;

        if (isCoopMatNV()) {
            rv = isCoopMatNV() && right.isCoopMatNV();
            if (getBasicType() == EbtFloat || getBasicType() == EbtFloat16)
                rv = right.getBasicType() == EbtFloat || right.getBasicType() == EbtFloat16;
            else if (getBasicType() == EbtUint || getBasicType() == EbtUint8 || getBasicType() == EbtUint16)
                rv = right.getBasicType() == EbtUint || right.getBasicType() == EbtUint8 || right.getBasicType() == EbtUint16;
            else if (getBasicType() == EbtInt || getBasicType() == EbtInt8 || getBasicType() == EbtInt16)
                rv = right.getBasicType() == EbtInt || right.getBasicType() == EbtInt8 || right.getBasicType() == EbtInt16;
            else
                rv = false;
        } else if (isCoopMatKHR() && right.isCoopMatKHR()) {
            if (getBasicType() == EbtFloat || getBasicType() == EbtFloat16)
                rv = right.getBasicType() == EbtFloat || right.getBasicType() == EbtFloat16 || right.getBasicType() == EbtCoopmat;
            else if (getBasicType() == EbtUint || getBasicType() == EbtUint8 || getBasicType() == EbtUint16)
                rv = right.getBasicType() == EbtUint || right.getBasicType() == EbtUint8 || right.getBasicType() == EbtUint16 || right.getBasicType() == EbtCoopmat;
            else if (getBasicType() == EbtInt || getBasicType() == EbtInt8 || getBasicType() == EbtInt16)
                rv = right.getBasicType() == EbtInt || right.getBasicType() == EbtInt8 || right.getBasicType() == EbtInt16 || right.getBasicType() == EbtCoopmat;
            else
                rv = false;
        }
        return rv;
    }